

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.h
# Opt level: O0

void miniros::close_signal_pair(signal_fd_t *signal_pair)

{
  int *in_RDI;
  
  close(*in_RDI);
  close(in_RDI[1]);
  return;
}

Assistant:

inline void close_signal_pair(signal_fd_t signal_pair[2]) {
#ifdef WIN32 // use a socket pair
	::closesocket(signal_pair[0]);
	::closesocket(signal_pair[1]);
#else // use a socket pair on mingw or pipe pair on linux, either way, close works
	::close(signal_pair[0]);
	::close(signal_pair[1]);
#endif
}